

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<int,_(anonymous_namespace)::Constructable_&>::streamReconstructedExpression
          (BinaryExpr<int,_(anonymous_namespace)::Constructable_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  string sStack_58;
  string local_38;
  
  Detail::stringify<int>(&local_38,(int *)&(this->super_ITransientExpression).field_0xc);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringRef::operator_cast_to_string(&sStack_58,(StringRef *)Detail::unprintableString);
  op.m_size = (size_type)&sStack_58;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_38,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }